

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int try_psk_handshake(ptls_t *tls,size_t *psk_index,int *accept_early_data,
                     st_ptls_client_hello_t *ch,ptls_iovec_t ch_trunc)

{
  st_ptls_get_time_t *psVar1;
  st_ptls_encrypt_ticket_t *psVar2;
  char *pcVar3;
  ptls_key_exchange_algorithm_t *ppVar4;
  bool bVar5;
  uint8_t *puVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  ptls_key_exchange_algorithm_t **pppVar10;
  ulong uVar11;
  size_t sVar12;
  ptls_context_t *ppVar13;
  ptls_key_schedule_t *sched;
  ptls_hash_context_t **pppVar14;
  ptls_iovec_t pVar15;
  ptls_iovec_t ikm;
  uint16_t ticket_csid;
  uint16_t ticket_key_exchange_id;
  ptls_key_schedule_t *local_100;
  int *local_f8;
  uint32_t age_add;
  ptls_buffer_t local_e8;
  ptls_context_t *local_c8;
  uint8_t *local_c0;
  size_t local_b8;
  uint64_t issue_at;
  ptls_iovec_t ticket_negotiated_protocol;
  ptls_iovec_t ticket_server_name;
  ptls_iovec_t ticket_psk;
  uint8_t binder_key [64];
  
  local_b8 = ch_trunc.len;
  local_c0 = ch_trunc.base;
  psVar1 = tls->ctx->get_time;
  local_f8 = accept_early_data;
  local_100 = (ptls_key_schedule_t *)(*psVar1->cb)(psVar1);
  local_e8.base = "";
  local_e8.capacity = 0;
  local_e8.off = 0;
  local_e8._24_8_ = (ulong)(uint)local_e8._28_4_ << 0x20;
  *psk_index = 0;
  if ((ch->psk).identities.count != 0) {
    uVar9 = 0;
    do {
      local_e8.off = 0;
      psVar2 = tls->ctx->encrypt_ticket;
      pVar15.len = (ch->psk).identities.list[uVar9].identity.len;
      pVar15.base = (ch->psk).identities.list[uVar9].identity.base;
      iVar7 = (*psVar2->cb)(psVar2,tls,0,&local_e8,pVar15);
      if (iVar7 == 0) {
        bVar5 = true;
LAB_00115270:
        iVar7 = decode_session_identifier
                          (&issue_at,&ticket_psk,&age_add,&ticket_server_name,
                           &ticket_key_exchange_id,&ticket_csid,&ticket_negotiated_protocol,
                           local_e8.base,local_e8.base + local_e8.off);
        sVar12 = ticket_server_name.len;
        if (((iVar7 == 0) && (issue_at <= local_100)) &&
           (ppVar13 = tls->ctx, (long)local_100 - issue_at <= (ulong)ppVar13->ticket_lifetime * 1000
           )) {
          *local_f8 = 0;
          if (bVar5 && ((ch->psk).field_0xb4 & 1) != 0) {
            uVar11 = (long)local_100 -
                     (issue_at + ((ch->psk).identities.list[uVar9].obfuscated_ticket_age - age_add))
            ;
            uVar9 = -uVar11;
            if (0 < (long)uVar11) {
              uVar9 = uVar11;
            }
            if ((ppVar13->max_early_data_size != 0) && (uVar9 < 0x2711)) {
              *local_f8 = 1;
            }
          }
          pcVar3 = tls->server_name;
          if (ticket_server_name.len == 0) {
            if (pcVar3 == (char *)0x0) goto LAB_0011539d;
          }
          else if (((pcVar3 != (char *)0x0) &&
                   (local_c8 = ppVar13,
                   iVar7 = strncmp((char *)ticket_server_name.base,pcVar3,ticket_server_name.len),
                   iVar7 == 0)) && (ppVar13 = local_c8, pcVar3[sVar12] == '\0')) {
LAB_0011539d:
            sVar12 = ticket_negotiated_protocol.len;
            pppVar10 = ppVar13->key_exchanges;
            ppVar4 = *pppVar10;
            while (ppVar4 != (ptls_key_exchange_algorithm_t *)0x0) {
              pppVar10 = pppVar10 + 1;
              if (ppVar4->id == ticket_key_exchange_id) {
                tls->key_share = ppVar4;
                if ((ticket_csid == tls->cipher_suite->id) &&
                   (((ticket_negotiated_protocol.len == 0 ||
                     (((pcVar3 = tls->negotiated_protocol, pcVar3 != (char *)0x0 &&
                       (iVar7 = strncmp((char *)ticket_negotiated_protocol.base,pcVar3,
                                        ticket_negotiated_protocol.len), iVar7 == 0)) &&
                      (pcVar3[sVar12] == '\0')))) &&
                    ((ticket_psk.len == (tls->key_schedule->hashes[0].algo)->digest_size &&
                     ((ch->psk).identities.list[*psk_index].binder.len == ticket_psk.len)))))) {
                  ikm.len = ticket_psk.len;
                  ikm.base = ticket_psk.base;
                  iVar7 = key_schedule_extract(tls->key_schedule,ikm);
                  if ((iVar7 == 0) &&
                     (iVar7 = derive_secret(tls->key_schedule,binder_key,"res binder"),
                     puVar6 = local_c0, iVar7 == 0)) {
                    sched = tls->key_schedule;
                    if (sched->num_hashes != 0) {
                      pppVar14 = &sched->hashes[0].ctx;
                      sVar12 = 0;
                      local_100 = sched;
                      do {
                        (*(*pppVar14)->update)(*pppVar14,puVar6,local_b8);
                        sVar12 = sVar12 + 1;
                        pppVar14 = pppVar14 + 2;
                      } while (sVar12 != local_100->num_hashes);
                      sched = tls->key_schedule;
                    }
                    iVar7 = calc_verify_data(binder_key,sched,binder_key);
                    if (iVar7 == 0) {
                      iVar8 = (*ptls_mem_equal)((ch->psk).identities.list[*psk_index].binder.base,
                                                binder_key,
                                                (tls->key_schedule->hashes[0].algo)->digest_size);
                      iVar7 = 0x33;
                      if (iVar8 != 0) {
                        iVar7 = 0;
                      }
                    }
                  }
                  goto LAB_001154f8;
                }
                break;
              }
              ppVar4 = *pppVar10;
            }
          }
        }
      }
      else if (iVar7 == 0x209) {
        bVar5 = false;
        goto LAB_00115270;
      }
      uVar9 = *psk_index + 1;
      *psk_index = uVar9;
    } while (uVar9 < (ch->psk).identities.count);
  }
  *psk_index = 0xffffffffffffffff;
  *local_f8 = 0;
  tls->key_share = (ptls_key_exchange_algorithm_t *)0x0;
  iVar7 = 0;
LAB_001154f8:
  (*ptls_clear_memory)(local_e8.base,local_e8.off);
  if (local_e8.is_allocated != 0) {
    free(local_e8.base);
  }
  local_e8.off = 0;
  local_e8.is_allocated = 0;
  local_e8._28_4_ = 0;
  local_e8.base = (uint8_t *)0x0;
  local_e8.capacity = 0;
  (*ptls_clear_memory)(binder_key,0x40);
  return iVar7;
}

Assistant:

static int try_psk_handshake(ptls_t *tls, size_t *psk_index, int *accept_early_data, struct st_ptls_client_hello_t *ch,
                             ptls_iovec_t ch_trunc)
{
    ptls_buffer_t decbuf;
    ptls_iovec_t ticket_psk, ticket_server_name, ticket_negotiated_protocol;
    uint64_t issue_at, now = tls->ctx->get_time->cb(tls->ctx->get_time);
    uint32_t age_add;
    uint16_t ticket_key_exchange_id, ticket_csid;
    uint8_t binder_key[PTLS_MAX_DIGEST_SIZE];
    int ret;

    ptls_buffer_init(&decbuf, "", 0);

    for (*psk_index = 0; *psk_index < ch->psk.identities.count; ++*psk_index) {
        struct st_ptls_client_hello_psk_t *identity = ch->psk.identities.list + *psk_index;
        /* decrypt and decode */
        int can_accept_early_data = 1;
        decbuf.off = 0;
        switch (tls->ctx->encrypt_ticket->cb(tls->ctx->encrypt_ticket, tls, 0, &decbuf, identity->identity)) {
        case 0: /* decrypted */
            break;
        case PTLS_ERROR_REJECT_EARLY_DATA: /* decrypted, but early data is rejected */
            can_accept_early_data = 0;
            break;
        default: /* decryption failure */
            continue;
        }
        if (decode_session_identifier(&issue_at, &ticket_psk, &age_add, &ticket_server_name, &ticket_key_exchange_id, &ticket_csid,
                                      &ticket_negotiated_protocol, decbuf.base, decbuf.base + decbuf.off) != 0)
            continue;
        /* check age */
        if (now < issue_at)
            continue;
        if (now - issue_at > (uint64_t)tls->ctx->ticket_lifetime * 1000)
            continue;
        *accept_early_data = 0;
        if (ch->psk.early_data_indication && can_accept_early_data) {
            /* accept early-data if abs(diff) between the reported age and the actual age is within += 10 seconds */
            int64_t delta = (now - issue_at) - (identity->obfuscated_ticket_age - age_add);
            if (delta < 0)
                delta = -delta;
            if (tls->ctx->max_early_data_size != 0 && delta <= PTLS_EARLY_DATA_MAX_DELAY)
                *accept_early_data = 1;
        }
        /* check server-name */
        if (ticket_server_name.len != 0) {
            if (tls->server_name == NULL)
                continue;
            if (!vec_is_string(ticket_server_name, tls->server_name))
                continue;
        } else {
            if (tls->server_name != NULL)
                continue;
        }
        { /* check key-exchange */
            ptls_key_exchange_algorithm_t **a;
            for (a = tls->ctx->key_exchanges; *a != NULL && (*a)->id != ticket_key_exchange_id; ++a)
                ;
            if (*a == NULL)
                continue;
            tls->key_share = *a;
        }
        /* check cipher-suite */
        if (ticket_csid != tls->cipher_suite->id)
            continue;
        /* check negotiated-protocol */
        if (ticket_negotiated_protocol.len != 0) {
            if (tls->negotiated_protocol == NULL)
                continue;
            if (!vec_is_string(ticket_negotiated_protocol, tls->negotiated_protocol))
                continue;
        }
        /* check the length of the decrypted psk and the PSK binder */
        if (ticket_psk.len != tls->key_schedule->hashes[0].algo->digest_size)
            continue;
        if (ch->psk.identities.list[*psk_index].binder.len != tls->key_schedule->hashes[0].algo->digest_size)
            continue;

        /* found */
        goto Found;
    }

    /* not found */
    *psk_index = SIZE_MAX;
    *accept_early_data = 0;
    tls->key_share = NULL;
    ret = 0;
    goto Exit;

Found:
    if ((ret = key_schedule_extract(tls->key_schedule, ticket_psk)) != 0)
        goto Exit;
    if ((ret = derive_secret(tls->key_schedule, binder_key, "res binder")) != 0)
        goto Exit;
    ptls__key_schedule_update_hash(tls->key_schedule, ch_trunc.base, ch_trunc.len);
    if ((ret = calc_verify_data(binder_key /* to conserve space, reuse binder_key for storing verify_data */, tls->key_schedule,
                                binder_key)) != 0)
        goto Exit;
    if (!ptls_mem_equal(ch->psk.identities.list[*psk_index].binder.base, binder_key,
                        tls->key_schedule->hashes[0].algo->digest_size)) {
        ret = PTLS_ALERT_DECRYPT_ERROR;
        goto Exit;
    }
    ret = 0;

Exit:
    ptls_buffer_dispose(&decbuf);
    ptls_clear_memory(binder_key, sizeof(binder_key));
    return ret;
}